

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.h
# Opt level: O3

void __thiscall
gimage::Polygon::draw<unsigned_char>
          (Polygon *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,float r,
          float g,float b)

{
  ulong uVar1;
  pointer pSVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  pSVar2 = (this->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->vertex).
                super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  if (lVar4 != 0) {
    lVar6 = 8;
    uVar1 = 0;
    uVar5 = (lVar4 >> 4) - 1;
    do {
      uVar3 = uVar1;
      drawLine<unsigned_char>
                (image,*(long *)((long)pSVar2->v + lVar6 + -8),*(long *)((long)pSVar2->v + lVar6),
                 pSVar2[uVar5].v[0],pSVar2[uVar5].v[1],r,g,b);
      uVar1 = uVar3 + 1;
      pSVar2 = (this->vertex).
               super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0x10;
      uVar5 = uVar3;
    } while (uVar1 < (ulong)((long)(this->vertex).
                                   super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4));
  }
  return;
}

Assistant:

void draw(Image<T> &image, float r, float g=-1, float b=-1) const
    {
      size_t j=vertex.size()-1;
      for (size_t i=0; i<vertex.size(); i++)
      {
        drawLine(image, vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1], r, g, b);
        j=i;
      }
    }